

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmres.h
# Opt level: O3

int GMRES<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,TPZFMatrix<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,TPZFMatrix<long_double> *H,int *m,int64_t *max_iter,
              double *tol,TPZFMatrix<long_double> *residual,int FromCurrent)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ulong *puVar5;
  TPZFMatrix<long_double> *pTVar6;
  TPZFMatrix<long_double> *v;
  ostream *poVar7;
  int64_t iVar8;
  long lVar9;
  longdouble *plVar10;
  TPZFMatrix<long_double> *pTVar11;
  long lVar12;
  ulong *puVar13;
  TPZFMatrix<long_double> *A_00;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble lVar20;
  longdouble in_ST1;
  longdouble lVar21;
  longdouble lVar22;
  longdouble in_ST3;
  longdouble lVar23;
  longdouble lVar24;
  longdouble in_ST5;
  longdouble lVar25;
  longdouble in_ST6;
  longdouble lVar26;
  longdouble in_ST7;
  longdouble lVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  TPZFMatrix<long_double> w;
  TPZFMatrix<long_double> s;
  TPZFMatrix<long_double> w1;
  TPZFMatrix<long_double> resbackup;
  double local_460;
  double local_448;
  long local_410;
  TPZFMatrix<long_double> local_390;
  TPZFMatrix<long_double> local_300;
  TPZFMatrix<long_double> local_270;
  TPZFMatrix<long_double> local_1e0;
  TPZFMatrix<long_double> local_150;
  TPZFMatrix<long_double> local_c0;
  
  iVar4 = *m;
  lVar16 = (long)iVar4 + 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_300.fElem = (longdouble *)0x0;
  local_300.fGiven = (longdouble *)0x0;
  local_300.fSize = 0;
  local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_300.fPivot.super_TPZVec<int>,0);
  local_300.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_300.fPivot.super_TPZVec<int>.fStore = local_300.fPivot.fExtAlloc;
  local_300.fPivot.super_TPZVec<int>.fNElements = 0;
  local_300.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_300.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_300.fWork.fStore = (longdouble *)0x0;
  local_300.fWork.fNElements = 0;
  local_300.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar28 = 0xffffffffffffffff;
    if (-2 < iVar4) {
      uVar28 = lVar16 * 0x10;
    }
    local_300.fElem = (longdouble *)operator_new__(uVar28);
  }
  iVar4 = *m;
  lVar16 = (long)iVar4 + 1;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_1e0.fElem = (longdouble *)0x0;
  local_1e0.fGiven = (longdouble *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_1e0.fWork.fStore = (longdouble *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar28 = 0xffffffffffffffff;
    if (-2 < iVar4) {
      uVar28 = lVar16 * 0x10;
    }
    local_1e0.fElem = (longdouble *)operator_new__(uVar28);
  }
  iVar4 = *m;
  lVar16 = (long)iVar4 + 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_270.fElem = (longdouble *)0x0;
  local_270.fGiven = (longdouble *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = lVar16;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_270.fWork.fStore = (longdouble *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  if ((int)lVar16 != 0) {
    uVar28 = 0xffffffffffffffff;
    if (-2 < iVar4) {
      uVar28 = lVar16 * 0x10;
    }
    local_270.fElem = (longdouble *)operator_new__(uVar28);
  }
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_150.fElem = (longdouble *)0x0;
  local_150.fGiven = (longdouble *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_150.fWork.fStore = (longdouble *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_390.fElem = (longdouble *)0x0;
  local_390.fGiven = (longdouble *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_390.fWork.fStore = (longdouble *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol = 0;
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<long_double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181e1d8;
  local_c0.fElem = (longdouble *)0x0;
  local_c0.fGiven = (longdouble *)0x0;
  local_c0.fSize = 0;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
  local_c0.fWork.fStore = (longdouble *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  A_00 = residual;
  if (residual == (TPZFMatrix<long_double> *)0x0) {
    A_00 = &local_c0;
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,b,A_00,0);
  Dot<long_double>(A_00,A_00);
  lVar22 = in_ST7;
  sqrtl();
  if (FromCurrent == 0) {
    (*(x->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
              ();
    TPZFMatrix<long_double>::operator=(A_00,b);
  }
  else {
    lVar22 = in_ST7;
    (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,A_00,0);
  }
  (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,&local_390,0);
  TPZFMatrix<long_double>::operator=(A_00,&local_390);
  lVar23 = lVar22;
  Dot<long_double>(A_00,A_00);
  lVar24 = lVar23;
  sqrtl();
  local_460 = (double)in_ST3;
  lVar21 = lVar24;
  Dot<long_double>(A_00,A_00);
  uVar28 = -(ulong)((double)in_ST1 == 0.0);
  dVar30 = (double)(~uVar28 & (ulong)(double)in_ST1 | uVar28 & 0x3ff0000000000000);
  lVar25 = lVar21;
  sqrtl();
  local_448 = (double)in_ST5 / dVar30;
  if (*tol < local_448) {
    iVar4 = *m;
    uVar15 = (ulong)(iVar4 + 1);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar15;
    uVar28 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x90),8) == 0) {
      uVar28 = SUB168(auVar3 * ZEXT816(0x90),0) | 8;
    }
    puVar5 = (ulong *)operator_new__(uVar28);
    *puVar5 = uVar15;
    if (iVar4 + 1 != 0) {
      lVar16 = 0;
      puVar13 = puVar5;
      do {
        puVar13[2] = 0;
        puVar13[3] = 0;
        *(undefined2 *)(puVar13 + 4) = 0;
        puVar13[1] = (ulong)&PTR__TPZFMatrix_0181e1d8;
        puVar13[5] = 0;
        puVar13[6] = 0;
        puVar13[7] = 0;
        TPZVec<int>::TPZVec((TPZVec<int> *)(puVar13 + 8),0);
        puVar13[8] = (ulong)&PTR__TPZManVector_01815498;
        puVar13[9] = (ulong)(puVar13 + 0xc);
        puVar13[10] = 0;
        puVar13[0xb] = 0;
        puVar13[0xf] = (ulong)&PTR__TPZVec_01813e70;
        puVar13[0x10] = 0;
        puVar13[0x11] = 0;
        puVar13[0x12] = 0;
        lVar16 = lVar16 + -0x90;
        puVar13 = puVar13 + 0x12;
      } while (-lVar16 != uVar15 * 0x90);
    }
    if (0 < *max_iter) {
      pTVar6 = &local_c0;
      if (residual != (TPZFMatrix<long_double> *)0x0) {
        pTVar6 = residual;
      }
      v = (TPZFMatrix<long_double> *)(puVar5 + 1);
      lVar16 = 1;
      do {
        lVar14 = (pTVar6->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        (*(v->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0xd])(v,lVar14,1);
        if (0 < lVar14) {
          plVar10 = pTVar6->fElem;
          uVar28 = puVar5[5];
          lVar9 = 0;
          do {
            *(longdouble *)(uVar28 + lVar9) =
                 (longdouble)((double)*(longdouble *)((long)plVar10 + lVar9) * (1.0 / local_460));
            lVar9 = lVar9 + 0x10;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        iVar8 = local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow;
        plVar10 = local_300.fElem;
        if (0 < local_300.super_TPZMatrix<long_double>.super_TPZBaseMatrix.fRow) {
          do {
            *plVar10 = (longdouble)0;
            plVar10 = plVar10 + 1;
            iVar8 = iVar8 + -1;
            lVar25 = lVar21;
          } while (iVar8 != 0);
        }
        *local_300.fElem = (longdouble)local_460;
        iVar4 = *m;
        lVar18 = lVar22;
        lVar19 = lVar23;
        lVar26 = lVar24;
        if ((0 < iVar4) && (lVar16 <= *max_iter)) {
          local_448 = 4.94065645841247e-324;
          local_460 = 0.0;
          lVar14 = 0;
          local_410 = lVar16;
          do {
            (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
                      (A,v + lVar14,&local_150,0);
            (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])
                      (M,&local_150,&local_390,0);
            lVar9 = 0;
            lVar16 = 0;
            pTVar11 = v;
            lVar18 = in_ST6;
            lVar19 = in_ST7;
            lVar26 = lVar25;
            do {
              in_ST7 = lVar24;
              in_ST6 = lVar23;
              lVar20 = lVar22;
              Dot<long_double>(&local_390,pTVar11);
              lVar12 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
              if ((lVar12 <= lVar16) ||
                 ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                TPZFMatrix<long_double>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              plVar10 = H->fElem;
              *(longdouble *)((long)plVar10 + lVar9 + (long)local_460 * lVar12) = lVar18;
              if ((lVar12 <= lVar16) ||
                 ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
                TPZFMatrix<long_double>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar27 = lVar26;
              TPZFMatrix<long_double>::ZAXPY
                        (&local_390,-*(longdouble *)((long)plVar10 + lVar9 + lVar12 * lVar14 * 0x10)
                         ,pTVar11);
              lVar16 = lVar16 + 1;
              pTVar11 = pTVar11 + 1;
              lVar9 = lVar9 + 0x10;
              lVar18 = lVar19;
              lVar19 = lVar20;
              lVar22 = in_ST6;
              lVar23 = in_ST7;
              lVar24 = lVar21;
              lVar21 = lVar25;
              lVar25 = lVar26;
              lVar26 = lVar27;
            } while (local_448 != (double)lVar16);
            Dot<long_double>(&local_390,&local_390);
            sqrtl();
            lVar9 = lVar14 + 1;
            lVar16 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if ((lVar16 <= lVar9) ||
               ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            H->fElem[lVar16 * lVar14 + lVar9] = lVar20;
            pTVar11 = v + lVar9;
            TPZFMatrix<long_double>::operator=(pTVar11,&local_390);
            if (((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow <= lVar9) ||
               ((H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar14)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            (*(pTVar11->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x26])(pTVar11);
            lVar16 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if (lVar14 != 0) {
              lVar17 = 1;
              lVar12 = 0;
              do {
                lVar1 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
                if (lVar1 <= lVar14 || lVar16 <= lVar17 + -1) {
                  TPZFMatrix<long_double>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                plVar10 = H->fElem;
                if ((lVar16 <= lVar17) || (lVar1 <= lVar14)) {
                  TPZFMatrix<long_double>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar22 = *(longdouble *)((long)local_1e0.fElem + lVar12);
                lVar23 = *(longdouble *)((long)plVar10 + lVar12 + lVar16 * (long)local_460);
                lVar24 = *(longdouble *)((long)local_270.fElem + lVar12);
                lVar21 = *(longdouble *)((long)plVar10 + lVar12 + 0x10 + lVar16 * lVar14 * 0x10);
                *(longdouble *)((long)plVar10 + lVar12 + 0x10 + lVar16 * lVar14 * 0x10) =
                     lVar22 * lVar21 - lVar24 * lVar23;
                *(longdouble *)((long)plVar10 + lVar12 + lVar16 * (long)local_460) =
                     lVar22 * lVar23 + lVar24 * lVar21;
                lVar12 = lVar12 + 0x10;
                lVar17 = lVar17 + 1;
              } while (local_460 != (double)lVar12);
            }
            lVar12 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
            if (lVar12 <= lVar14 || lVar16 <= lVar14) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar16 <= lVar9) || (lVar12 <= lVar14)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            GeneratePlaneRotation<long_double>
                      (H->fElem + lVar14 + lVar16 * lVar14,H->fElem + lVar9 + lVar16 * lVar14,
                       local_1e0.fElem + lVar14,local_270.fElem + lVar14);
            lVar16 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            lVar12 = (H->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
            if (lVar12 <= lVar14 || lVar16 <= lVar14) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            plVar10 = H->fElem;
            lVar17 = lVar16 * lVar14;
            if ((lVar16 <= lVar9) || (lVar12 <= lVar14)) {
              TPZFMatrix<long_double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds")
              ;
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar22 = local_1e0.fElem[lVar14];
            lVar23 = plVar10[lVar14 + lVar17];
            lVar24 = local_270.fElem[lVar14];
            lVar21 = plVar10[lVar17 + lVar9];
            plVar10[lVar17 + lVar9] = lVar22 * lVar21 - lVar24 * lVar23;
            plVar10[lVar14 + lVar17] = lVar22 * lVar23 + lVar24 * lVar21;
            lVar22 = local_1e0.fElem[lVar14];
            lVar23 = local_270.fElem[lVar14];
            lVar24 = local_300.fElem[lVar9];
            lVar21 = lVar22 * lVar24 - lVar23 * local_300.fElem[lVar14];
            local_300.fElem[lVar9] = lVar21;
            local_300.fElem[lVar14] = lVar22 * local_300.fElem[lVar14] + lVar23 * lVar24;
            dVar29 = (double)ABS(lVar21) / dVar30;
            if (dVar29 < *tol) {
              Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,lVar14,H,&local_300,v);
              *tol = dVar29;
              *max_iter = local_410;
              uVar28 = *puVar5;
              uVar15 = uVar28 * 0x90 + 8;
              if (uVar28 != 0) {
                lVar16 = uVar28 * 0x90;
                do {
                  TPZFMatrix<long_double>::~TPZFMatrix
                            ((TPZFMatrix<long_double> *)((long)puVar5 + lVar16 + -0x88));
                  lVar16 = lVar16 + -0x90;
                } while (lVar16 != 0);
              }
              goto LAB_00c4c79e;
            }
            lVar16 = local_410 + 1;
            iVar4 = *m;
            lVar18 = in_ST7;
            lVar19 = in_ST7;
            lVar26 = in_ST7;
            lVar21 = in_ST7;
            lVar25 = in_ST7;
            if (iVar4 <= lVar9) break;
            local_448 = (double)((long)local_448 + 1);
            local_460 = (double)((long)local_460 + 0x10);
            bVar2 = local_410 < *max_iter;
            lVar14 = lVar9;
            lVar22 = in_ST7;
            lVar23 = in_ST7;
            lVar24 = in_ST7;
            local_410 = lVar16;
          } while (bVar2);
        }
        lVar24 = lVar25;
        lVar23 = lVar21;
        lVar22 = lVar26;
        in_ST6 = lVar18;
        Update<TPZFMatrix<long_double>,TPZFMatrix<long_double>>(x,(long)(iVar4 + -1),H,&local_300,v)
        ;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])(A,x,b,A_00,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,A_00,A_00,0);
        lVar21 = lVar24;
        Dot<long_double>(A_00,A_00);
        lVar25 = lVar21;
        sqrtl();
        local_460 = (double)in_ST7;
        local_448 = local_460 / dVar30;
        if (local_448 < *tol) goto LAB_00c4c80f;
        in_ST7 = lVar19;
      } while (lVar16 <= *max_iter);
    }
    *tol = local_448;
    uVar28 = *puVar5;
    if (uVar28 != 0) {
      lVar16 = uVar28 * 0x90;
      do {
        TPZFMatrix<long_double>::~TPZFMatrix
                  ((TPZFMatrix<long_double> *)((long)puVar5 + lVar16 + -0x88));
        lVar16 = lVar16 + -0x90;
      } while (lVar16 != 0);
    }
    operator_delete__(puVar5,uVar28 * 0x90 + 8);
    iVar4 = 1;
    goto LAB_00c4c7ad;
  }
  *tol = local_448;
  TPZFMatrix<long_double>::operator+=(x,&A_00->super_TPZMatrix<long_double>);
  *max_iter = 0;
  goto LAB_00c4c7ab;
LAB_00c4c80f:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iter ",5);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," - ",3);
  poVar7 = std::ostream::_M_insert<double>(local_448);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  *tol = local_448;
  *max_iter = lVar16;
  uVar28 = *puVar5;
  uVar15 = uVar28 * 0x90 + 8;
  if (uVar28 != 0) {
    lVar16 = uVar28 * 0x90;
    do {
      TPZFMatrix<long_double>::~TPZFMatrix
                ((TPZFMatrix<long_double> *)((long)puVar5 + lVar16 + -0x88));
      lVar16 = lVar16 + -0x90;
    } while (lVar16 != 0);
  }
LAB_00c4c79e:
  operator_delete__(puVar5,uVar15);
LAB_00c4c7ab:
  iVar4 = 0;
LAB_00c4c7ad:
  TPZFMatrix<long_double>::~TPZFMatrix(&local_c0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_390);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_150);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_270);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<long_double>::~TPZFMatrix(&local_300);
  return iVar4;
}

Assistant:

int 
GMRES( Operator &A, Vector &x, const Vector &b,
	  Preconditioner &M, Matrix &H, int &m, int64_t &max_iter,
	  Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	int64_t j = 1, k;
	Vector s(m+1), cs(m+1), sn(m+1), w1,w;
	
	//  Real normb = norm(M.Solve(b));
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
    M.Solve(b,r);
	Real normb = TPZExtractVal::val(Norm(r));	//  Vector r = b - A*x;
	if(FromCurrent) 
    {
        A.MultAdd(x,b,r,-1.,1.);
    } 
    else 
    {
		x.Zero();
		r = b;
	}
	M.Solve(r,w);
	r=w;
	Real beta = TPZExtractVal::val(Norm(r));
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = ((Real)TPZExtractVal::val(Norm(r))) / normb) <= tol) {
		tol = resid;
		x+=r;
		max_iter = 0;
		return 0;
	}
	
	Vector *v = new Vector[m+1];
	
	while (j <= max_iter) {
        int64_t rows = r.Rows();
        v[0].Resize(rows,1);
        for (int64_t i=0; i<rows; i++) {
            v[0](i) = TPZExtractVal::val(r(i)) * ((Real)(1.0/beta));
        }
        int64_t srows = s.Rows();
        for (int64_t i=0; i<srows; i++) {
            s(i) = REAL(0.);
        }
//		v[0] = r * (REAL(1.0 / beta));    // ??? r / beta
//		s = REAL(0.0);
		s(0) = beta;
		
		for (int64_t i = 0; i < m && j <= max_iter; i++, j++) {
			A.Multiply(v[i],w1);
			M.Solve(w1,w);
			for (k = 0; k <= i; k++) {
				H(k, i) = Dot(w, v[k]);
				w.ZAXPY(-H(k, i), v[k]);
			}
			H(i+1, i) = Norm(w);
			v[i+1] = w;
			v[i+1] *= (1.0)/TPZExtractVal::val(H(i+1,i));
			
			for (k = 0; k < i; k++)
				ApplyPlaneRotation(H(k,i), H(k+1,i), cs(k), sn(k));
			
			GeneratePlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(H(i,i), H(i+1,i), cs(i), sn(i));
			ApplyPlaneRotation(s(i), s(i+1), cs(i), sn(i));
			resid = ((Real)fabs(s(i+1)))/normb;
			if (resid < tol) {
				Update(x, i, H, s, v);
				tol = resid;
				max_iter = j;
				delete [] v;
				return 0;
			}
		}
		Update(x, m - 1, H, s, v);
		A.MultAdd(x,b,r,-1.,1.);
		M.Solve(r,r);
		beta = TPZExtractVal::val(Norm(r));
        resid = beta/normb;
		if (resid < tol) {
            std::cout << "iter " << j << " - " << resid << std::endl;
			tol = resid;
			max_iter = j;
			delete [] v;
			return 0;
		}
	}
	
	tol = resid;
	delete [] v;
	return 1;
}